

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O0

void testTranslationRotationMatrix<float>(M44d *mat)

{
  int iVar1;
  reference pvVar2;
  reference m;
  reference pvVar3;
  Vec3<double> *v;
  double dVar4;
  double b_00;
  double c;
  V3d b2;
  V3d b1;
  V3d b_1;
  V3d a_1;
  size_t i_1;
  float eps;
  M44d m2;
  M44d m1;
  vector<float,_std::allocator<float>_> weights;
  V3d b;
  V3d a;
  size_t i;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> to;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> from;
  size_t numPoints;
  value_type *in_stack_fffffffffffffd18;
  size_type __n;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
  *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  undefined4 uVar5;
  value_type_conflict1 *in_stack_fffffffffffffd30;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *this;
  size_type in_stack_fffffffffffffd38;
  Matrix44<double> *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  undefined4 uVar6;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
  *in_stack_fffffffffffffd50;
  Vec3<double> local_200;
  Vec3<double> local_1e8;
  size_type local_1d0;
  undefined4 local_1c4;
  Vec3 local_1c0 [24];
  Matrix44<double> *in_stack_fffffffffffffe58;
  ostream *in_stack_fffffffffffffe60;
  Vec3 local_140 [132];
  undefined4 local_bc;
  vector<float,_std::allocator<float>_> local_b8;
  Vec3<float> local_a0;
  Vec3<float> local_94;
  Vec3<double> local_88;
  Vec3<double> local_70;
  ulong local_58;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> local_50;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> local_38;
  ulong local_20;
  
  std::operator<<((ostream *)&std::cout,"Testing known translate/rotate matrix:\n ");
  Imath_3_2::operator<<(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  if (testTranslationRotationMatrix<float>(Imath_3_2::Matrix44<double>const&)::rand == '\0') {
    iVar1 = __cxa_guard_acquire(&testTranslationRotationMatrix<float>(Imath_3_2::Matrix44<double>const&)
                                 ::rand);
    if (iVar1 != 0) {
      Imath_3_2::Rand48::Rand48
                ((Rand48 *)in_stack_fffffffffffffd20,(unsigned_long)in_stack_fffffffffffffd18);
      __cxa_guard_release(&testTranslationRotationMatrix<float>(Imath_3_2::Matrix44<double>const&)::
                           rand);
    }
  }
  local_20 = 7;
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::vector
            ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)0x18e9bc);
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::reserve
            (in_stack_fffffffffffffd50,CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)
            );
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::vector
            ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)0x18e9e5);
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::reserve
            (in_stack_fffffffffffffd50,CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)
            );
  for (local_58 = 0; local_58 < local_20; local_58 = local_58 + 1) {
    dVar4 = Imath_3_2::Rand48::nextf((Rand48 *)0x18ea27);
    b_00 = Imath_3_2::Rand48::nextf((Rand48 *)0x18ea3b);
    c = Imath_3_2::Rand48::nextf((Rand48 *)0x18ea4f);
    Imath_3_2::Vec3<double>::Vec3(&local_70,dVar4,b_00,c);
    Imath_3_2::operator*
              ((Vec3<double> *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
               in_stack_fffffffffffffd40);
    Imath_3_2::Vec3<float>::Vec3<double>(&local_94,&local_70);
    std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::push_back
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    Imath_3_2::Vec3<float>::Vec3<double>(&local_a0,&local_88);
    std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::push_back
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  }
  local_bc = 0x3f800000;
  std::allocator<float>::allocator((allocator<float> *)0x18eb8a);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd40,
             in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  std::allocator<float>::~allocator((allocator<float> *)0x18ebb8);
  uVar6 = 0;
  this = (vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)0x0;
  pvVar2 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                     (&local_38,0);
  m = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                (&local_50,(size_type)this);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_b8,(size_type)this);
  Imath_3_2::procrustesRotationAndTranslation<float>
            (local_140,(Vec3 *)pvVar2,&m->x,(ulong)pvVar3,SUB81(local_20,0));
  uVar5 = 0;
  __n = 0;
  v = (Vec3<double> *)
      std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                (&local_38,0);
  pvVar2 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                     (&local_50,__n);
  Imath_3_2::procrustesRotationAndTranslation<float>
            (local_1c0,(Vec3 *)v,(ulong)pvVar2,SUB81(local_20,0));
  local_1c4 = 0x38d1b717;
  local_1d0 = 0;
  while( true ) {
    if (local_20 <= local_1d0) {
      std::operator<<((ostream *)&std::cout,"  OK\n");
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)this);
      std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::~vector(this);
      std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::~vector(this);
      return;
    }
    pvVar2 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::
             operator[](&local_38,local_1d0);
    Imath_3_2::Vec3<double>::Vec3<float>(&local_1e8,pvVar2);
    pvVar2 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::
             operator[](&local_50,local_1d0);
    Imath_3_2::Vec3<double>::Vec3<float>(&local_200,pvVar2);
    Imath_3_2::operator*
              ((Vec3<double> *)CONCAT44(uVar6,in_stack_fffffffffffffd48),(Matrix44<double> *)m);
    Imath_3_2::operator*
              ((Vec3<double> *)CONCAT44(uVar6,in_stack_fffffffffffffd48),(Matrix44<double> *)m);
    Imath_3_2::Vec3<double>::operator-((Vec3<double> *)CONCAT44(uVar5,in_stack_fffffffffffffd28),v);
    dVar4 = Imath_3_2::Vec3<double>::length
                      ((Vec3<double> *)CONCAT44(uVar5,in_stack_fffffffffffffd28));
    if (9.999999747378752e-05 <= dVar4) break;
    Imath_3_2::Vec3<double>::operator-((Vec3<double> *)CONCAT44(uVar5,in_stack_fffffffffffffd28),v);
    dVar4 = Imath_3_2::Vec3<double>::length
                      ((Vec3<double> *)CONCAT44(uVar5,in_stack_fffffffffffffd28));
    if (9.999999747378752e-05 <= dVar4) {
      __assert_fail("(b - b2).length () < eps",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                    ,0x3c,"void testTranslationRotationMatrix(const Imath_3_2::M44d &) [T = float]")
      ;
    }
    local_1d0 = local_1d0 + 1;
  }
  __assert_fail("(b - b1).length () < eps",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                ,0x3b,"void testTranslationRotationMatrix(const Imath_3_2::M44d &) [T = float]");
}

Assistant:

void
testTranslationRotationMatrix (const IMATH_INTERNAL_NAMESPACE::M44d& mat)
{
    std::cout << "Testing known translate/rotate matrix:\n " << mat;
    typedef IMATH_INTERNAL_NAMESPACE::Vec3<T> Vec;

    static IMATH_INTERNAL_NAMESPACE::Rand48 rand (2047);

    size_t           numPoints = 7;
    std::vector<Vec> from;
    from.reserve (numPoints);
    std::vector<Vec> to;
    to.reserve (numPoints);
    for (size_t i = 0; i < numPoints; ++i)
    {
        IMATH_INTERNAL_NAMESPACE::V3d a (
            rand.nextf (), rand.nextf (), rand.nextf ());
        IMATH_INTERNAL_NAMESPACE::V3d b = a * mat;

        from.push_back (Vec (a));
        to.push_back (Vec (b));
    }

    std::vector<T>                       weights (numPoints, T (1));
    const IMATH_INTERNAL_NAMESPACE::M44d m1 = procrustesRotationAndTranslation (
        &from[0], &to[0], &weights[0], numPoints);
    const IMATH_INTERNAL_NAMESPACE::M44d m2 =
        procrustesRotationAndTranslation (&from[0], &to[0], numPoints);

    const T eps = sizeof (T) == 8 ? T(1e-8) : T(1e-4);
    for (size_t i = 0; i < numPoints; ++i)
    {
        const IMATH_INTERNAL_NAMESPACE::V3d a  = from[i];
        const IMATH_INTERNAL_NAMESPACE::V3d b  = to[i];
        const IMATH_INTERNAL_NAMESPACE::V3d b1 = a * m1;
        const IMATH_INTERNAL_NAMESPACE::V3d b2 = a * m2;

        assert ((b - b1).length () < eps);
        assert ((b - b2).length () < eps);
    }
    std::cout << "  OK\n";
}